

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

StructBuilder * __thiscall
capnp::_::ListBuilder::getStructElement
          (StructBuilder *__return_storage_ptr__,ListBuilder *this,ElementCount index)

{
  unsigned_long uVar1;
  ulong uVar2;
  Fault local_30;
  Fault f;
  byte *structData;
  unsigned_long indexBit;
  ElementCount index_local;
  ListBuilder *this_local;
  
  uVar1 = upgradeBound<unsigned_long,unsigned_int>(index);
  uVar2 = uVar1 * this->step;
  f.exception = (Exception *)(this->ptr + (uVar2 >> 3));
  if ((uVar2 & 7) == 0) {
    StructBuilder::StructBuilder
              (__return_storage_ptr__,this->segment,this->capTable,f.exception,
               (WirePointer *)
               ((long)(f.exception)->trace + ((ulong)(this->structDataSize >> 3) - 0x50)),
               this->structDataSize,this->structPointerCount);
    return __return_storage_ptr__;
  }
  kj::_::Debug::Fault::Fault
            (&local_30,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
             ,0xbe3,FAILED,"indexBit % BITS_PER_BYTE == ZERO * BITS","");
  kj::_::Debug::Fault::fatal(&local_30);
}

Assistant:

StructBuilder ListBuilder::getStructElement(ElementCount index) {
  auto indexBit = upgradeBound<uint64_t>(index) * step;
  byte* structData = ptr + indexBit / BITS_PER_BYTE;
  KJ_DASSERT(indexBit % BITS_PER_BYTE == ZERO * BITS);
  return StructBuilder(segment, capTable, structData,
      reinterpret_cast<WirePointer*>(structData + structDataSize / BITS_PER_BYTE),
      structDataSize, structPointerCount);
}